

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataRequest.h
# Opt level: O0

void __thiscall
FIX44::MarketDataRequest::MarketDataRequest
          (MarketDataRequest *this,MDReqID *aMDReqID,
          SubscriptionRequestType *aSubscriptionRequestType,MarketDepth *aMarketDepth)

{
  MsgType local_80;
  MarketDepth *local_28;
  MarketDepth *aMarketDepth_local;
  SubscriptionRequestType *aSubscriptionRequestType_local;
  MDReqID *aMDReqID_local;
  MarketDataRequest *this_local;
  
  local_28 = aMarketDepth;
  aMarketDepth_local = (MarketDepth *)aSubscriptionRequestType;
  aSubscriptionRequestType_local = (SubscriptionRequestType *)aMDReqID;
  aMDReqID_local = (MDReqID *)this;
  MsgType();
  FIX44::Message::Message(&this->super_Message,&local_80);
  FIX::MsgType::~MsgType(&local_80);
  *(undefined ***)&this->super_Message = &PTR__MarketDataRequest_0018a770;
  set(this,(MDReqID *)aSubscriptionRequestType_local);
  set(this,(SubscriptionRequestType *)aMarketDepth_local);
  set(this,local_28);
  return;
}

Assistant:

MarketDataRequest(
      const FIX::MDReqID& aMDReqID,
      const FIX::SubscriptionRequestType& aSubscriptionRequestType,
      const FIX::MarketDepth& aMarketDepth )
    : Message(MsgType())
    {
      set(aMDReqID);
      set(aSubscriptionRequestType);
      set(aMarketDepth);
    }